

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__2,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  char *in_RCX;
  AlphaNum *in_R8;
  string_view src;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string_view local_48 [3];
  
  local_48[0] = NullSafeStringView("undefined annotation variable: \"");
  src._M_str = in_RCX;
  src._M_len = *(size_t *)(this + 8);
  CHexEscape_abi_cxx11_(&local_c8,*(lts_20250127 **)this,src);
  local_78.piece_._M_len = local_c8._M_string_length;
  local_78.piece_._M_str = local_c8._M_dataplus._M_p;
  local_a8.piece_ = NullSafeStringView("\"");
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_48,&local_78,&local_a8,in_R8);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}